

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 Compress_BitPacking_16
                (UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmpParams)

{
  byte bVar1;
  UINT8 UVar2;
  UINT8 UVar3;
  ushort uVar4;
  FUINT8 FVar5;
  ushort uVar6;
  UINT16 UVar7;
  ushort uVar8;
  uint dstLen;
  uint uVar9;
  UINT8 *pUVar10;
  short local_7a;
  FUINT8 inBit;
  FUINT8 bitMask;
  FUINT8 outValB;
  FUINT8 bitWriteVal;
  FUINT8 bitsToWrite;
  UINT16 *ent2B;
  FUINT16 ent2Mask;
  UINT32 ent2Count;
  FUINT8 outShift;
  FUINT8 inShift;
  FUINT16 inVal;
  UINT8 *inDataEnd;
  byte *pbStack_48;
  UINT32 inLenMax;
  UINT8 *outPos;
  UINT8 *inPos;
  FUINT16 addVal;
  FUINT8 bitsCmp;
  PCM_CMP_INF *cmpParams_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 *outData_local;
  UINT32 outLen_local;
  
  bVar1 = cmpParams->bitsCmp;
  uVar6 = (ushort)bVar1;
  uVar4 = cmpParams->baseVal;
  dstLen = 1 << (cmpParams->bitsDec & 0x1f);
  _bitMask = (UINT16 *)0x0;
  if (cmpParams->subType == '\x02') {
    if (cmpParams->comprTbl->valueCount == 0) {
      return '\x10';
    }
    if ((cmpParams->bitsDec != cmpParams->comprTbl->bitsDec) ||
       (cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)) {
      return '\x11';
    }
    _bitMask = (UINT16 *)malloc((ulong)dstLen << 1);
    GenerateReverseLUT_16
              (dstLen,_bitMask,(uint)cmpParams->comprTbl->valueCount,
               (cmpParams->comprTbl->values).d16);
  }
  ent2Mask._0_2_ = 0;
  UVar2 = cmpParams->bitsDec;
  uVar9 = SUB164((ZEXT416(outLen) << 4) / ZEXT116(cmpParams->bitsCmp),0);
  inData_local._4_4_ = inLen;
  if (uVar9 < inLen) {
    inData_local._4_4_ = uVar9;
  }
  pUVar10 = inData + inData_local._4_4_;
  UVar3 = cmpParams->subType;
  pbStack_48 = outData;
  outPos = inData;
  if (UVar3 == '\0') {
    for (; outPos < pUVar10; outPos = outPos + 2) {
      UVar7 = ReadLE16(outPos);
      local_7a = 0;
      *pbStack_48 = *pbStack_48 & ((byte)(0xff >> ((byte)(ushort)ent2Mask & 0x1f)) ^ 0xff);
      inBit = uVar6;
      while (inBit != 0) {
        FVar5 = inBit;
        if (7 < inBit) {
          FVar5 = 8;
        }
        inBit = inBit - FVar5;
        uVar8 = (ushort)((uint)UVar7 - (uint)uVar4 >> ((byte)local_7a & 0x1f)) &
                (short)(1 << ((byte)FVar5 & 0x1f)) - 1U;
        ent2Mask._0_2_ = (ushort)ent2Mask + FVar5;
        *pbStack_48 = *pbStack_48 |
                      (byte)((int)((uint)uVar8 << 8) >> ((byte)(ushort)ent2Mask & 0x1f));
        if (7 < (ushort)ent2Mask) {
          ent2Mask._0_2_ = (ushort)ent2Mask - 8;
          pbStack_48 = pbStack_48 + 1;
          *pbStack_48 = (byte)((int)((uint)uVar8 << 8) >> ((byte)(ushort)ent2Mask & 0x1f));
        }
        local_7a = local_7a + FVar5;
      }
    }
  }
  else if (UVar3 == '\x01') {
    for (; outPos < pUVar10; outPos = outPos + 2) {
      UVar7 = ReadLE16(outPos);
      local_7a = 0;
      *pbStack_48 = *pbStack_48 & ((byte)(0xff >> ((byte)(ushort)ent2Mask & 0x1f)) ^ 0xff);
      inBit = uVar6;
      while (inBit != 0) {
        FVar5 = inBit;
        if (7 < inBit) {
          FVar5 = 8;
        }
        inBit = inBit - FVar5;
        uVar8 = (ushort)(((uint)UVar7 - (uint)uVar4 >> (UVar2 - bVar1 & 0x1f)) >>
                        ((byte)local_7a & 0x1f)) & (short)(1 << ((byte)FVar5 & 0x1f)) - 1U;
        ent2Mask._0_2_ = (ushort)ent2Mask + FVar5;
        *pbStack_48 = *pbStack_48 |
                      (byte)((int)((uint)uVar8 << 8) >> ((byte)(ushort)ent2Mask & 0x1f));
        if (7 < (ushort)ent2Mask) {
          ent2Mask._0_2_ = (ushort)ent2Mask - 8;
          pbStack_48 = pbStack_48 + 1;
          *pbStack_48 = (byte)((int)((uint)uVar8 << 8) >> ((byte)(ushort)ent2Mask & 0x1f));
        }
        local_7a = local_7a + FVar5;
      }
    }
  }
  else if (UVar3 == '\x02') {
    for (; outPos < pUVar10; outPos = outPos + 2) {
      UVar7 = ReadLE16(outPos);
      uVar4 = _bitMask[(uint)UVar7 & dstLen - 1];
      local_7a = 0;
      *pbStack_48 = *pbStack_48 & ((byte)(0xff >> ((byte)(ushort)ent2Mask & 0x1f)) ^ 0xff);
      inBit = uVar6;
      while (inBit != 0) {
        FVar5 = inBit;
        if (7 < inBit) {
          FVar5 = 8;
        }
        inBit = inBit - FVar5;
        uVar8 = uVar4 >> ((byte)local_7a & 0x1f) & (short)(1 << ((byte)FVar5 & 0x1f)) - 1U;
        ent2Mask._0_2_ = (ushort)ent2Mask + FVar5;
        *pbStack_48 = *pbStack_48 |
                      (byte)((int)((uint)uVar8 << 8) >> ((byte)(ushort)ent2Mask & 0x1f));
        if (7 < (ushort)ent2Mask) {
          ent2Mask._0_2_ = (ushort)ent2Mask - 8;
          pbStack_48 = pbStack_48 + 1;
          *pbStack_48 = (byte)((int)((uint)uVar8 << 8) >> ((byte)(ushort)ent2Mask & 0x1f));
        }
        local_7a = local_7a + FVar5;
      }
    }
  }
  if (_bitMask != (UINT16 *)0x0) {
    free(_bitMask);
  }
  return '\0';
}

Assistant:

static UINT8 Compress_BitPacking_16(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmpParams)
{
	FUINT8 bitsCmp;
	FUINT16 addVal;
	const UINT8* inPos;
	UINT8* outPos;
	UINT32 inLenMax;
	const UINT8* inDataEnd;
	FUINT16 inVal;
	FUINT8 inShift;
	FUINT8 outShift;
	UINT32 ent2Count;
	FUINT16 ent2Mask;
	UINT16* ent2B;
	//UINT16 curVal;
	
	// ReadBits Variables
	FUINT8 bitsToWrite;
	FUINT8 bitWriteVal;
	FUINT8 outValB;
	FUINT8 bitMask;
	FUINT8 inBit;
	
	// --- Bit Packing compression --- (8 bit input)
	bitsCmp = cmpParams->bitsCmp;
	addVal = cmpParams->baseVal;
	ent2Count = 1 << cmpParams->bitsDec;
	ent2Mask = (FUINT16)(ent2Count - 1);
	ent2B = NULL;
	if (cmpParams->subType == 0x02)
	{
		ent2B = cmpParams->comprTbl->values.d16;
		if (! cmpParams->comprTbl->valueCount)
		{
			return 0x10;	// Error: no table loaded
		}
		else if (cmpParams->bitsDec != cmpParams->comprTbl->bitsDec ||
			cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)
		{
			return 0x11;	// Data block and loaded value table incompatible
		}
		ent2B = (UINT16*)malloc(ent2Count * sizeof(UINT16));
		GenerateReverseLUT_16(ent2Count, ent2B, cmpParams->comprTbl->valueCount, cmpParams->comprTbl->values.d16);
	}
	
	outShift = 0;
	inShift = cmpParams->bitsDec - bitsCmp;
	inLenMax = MUL_DIV(outLen, 16, cmpParams->bitsCmp);
	if (inLen > inLenMax)
		inLen = inLenMax;
	inDataEnd = inData + inLen;
	
	switch(cmpParams->subType)
	{
	case 0x00:	// Copy
		for (inPos = inData, outPos = outData; inPos < inDataEnd; inPos += 0x02)
		{
			inVal = ReadLE16(inPos);
			inVal = inVal - addVal;
			WRITE_BITS(outPos, inVal, outShift, bitsCmp);
		}
		break;
	case 0x01:	// Shift Left
		for (inPos = inData, outPos = outData; inPos < inDataEnd; inPos += 0x02)
		{
			inVal = ReadLE16(inPos);
			inVal = (inVal - addVal) >> inShift;
			WRITE_BITS(outPos, inVal, outShift, bitsCmp);
		}
		break;
	case 0x02:	// Table
		for (inPos = inData, outPos = outData; inPos < inDataEnd; inPos += 0x02)
		{
#if 0
			inVal = ReadLE16(inPos);
			for (curVal = 0x00; curVal < cmpParams->comprTbl->valueCount; curVal ++)
			{
				if (inVal == cmpParams->comprTbl->values.d16[curVal])
					break;
			}
			inVal = (FUINT16)curVal;
#else
			inVal = ent2B[ReadLE16(inPos) & ent2Mask];
#endif
			WRITE_BITS(outPos, inVal, outShift, bitsCmp);
		}
		break;
	}
	if (ent2B != NULL)
		free(ent2B);
	
	return 0x00;
}